

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::AsmJsByteCodeDumper::
     DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,
               OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 local_38 [8];
  WAsmJsMemTag tag;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCodeAsmJs op_local;
  
  tag.heapTag = (char16 *)reader;
  InitializeWAsmJsMemTag(data->ViewType,(WAsmJsMemTag *)local_38);
  if (op == LdArrWasm) {
LAB_00af2368:
    Output::Print(L" %c%d = %s[I%d + %d]",(ulong)(ushort)local_38._0_2_,(ulong)data->Value,tag._0_8_
                  ,(ulong)data->SlotIndex,(ulong)data->Offset);
  }
  else {
    if (op != StArrWasm) {
      if (op == LdArrAtomic) goto LAB_00af2368;
      if (op != StArrAtomic) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                    ,0x24d,"((0))","(0)");
        if (bVar2) {
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
          return;
        }
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    Output::Print(L" %s[I%d + %d] = %c%d",tag._0_8_,(ulong)data->SlotIndex,(ulong)data->Offset,
                  (ulong)(ushort)local_38._0_2_,(ulong)data->Value);
  }
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpWasmMemAccess(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        WAsmJsMemTag tag;
        InitializeWAsmJsMemTag(data->ViewType, &tag);
        switch (op)
        {
        case OpCodeAsmJs::LdArrWasm:
        case OpCodeAsmJs::LdArrAtomic:
            Output::Print(_u(" %c%d = %s[I%d + %d]"), tag.valueTag, data->Value, tag.heapTag, data->SlotIndex, data->Offset); break;
        case OpCodeAsmJs::StArrWasm:
        case OpCodeAsmJs::StArrAtomic:
            Output::Print(_u(" %s[I%d + %d] = %c%d"), tag.heapTag, data->SlotIndex, data->Offset, tag.valueTag, data->Value); break;
        default:
            Assume(UNREACHED);
        }
    }